

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O2

bool pybind11::detail::raise_err(PyObject *exc_type,char *msg)

{
  long lVar1;
  
  lVar1 = PyErr_Occurred();
  if (lVar1 == 0) {
    PyErr_SetString();
  }
  else {
    raise_from(exc_type,msg);
  }
  return lVar1 != 0;
}

Assistant:

inline bool raise_err(PyObject *exc_type, const char *msg) {
    if (PyErr_Occurred()) {
        raise_from(exc_type, msg);
        return true;
    }
    set_error(exc_type, msg);
    return false;
}